

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O2

string * __thiscall
Kraken::KClient::private_method
          (string *__return_storage_ptr__,KClient *this,string *method,KInput *input)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  int *piVar4;
  char *pcVar5;
  runtime_error *prVar6;
  string postdata;
  string key_header;
  string sign_header;
  string nonce;
  string path;
  string method_url;
  string local_1c8 [32];
  ostringstream oss;
  
  std::operator+(&postdata,"/",&this->version_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,&postdata
                 ,"/private/");
  std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 method);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&postdata);
  std::operator+(&method_url,&this->url_,&path);
  curl_easy_setopt(this->curl_,0x2712,method_url._M_dataplus._M_p);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  iVar1 = gettimeofday((timeval *)&key_header,(__timezone_ptr_t)0x0);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&oss,"gettimeofday() failed: ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar2,pcVar5);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&postdata);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = std::operator<<(&oss,0x30);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 10;
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 6;
  std::ostream::_M_insert<long>((long)poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  std::operator+(&postdata,"nonce=",&nonce);
  if ((input->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator+(&key_header,&postdata,"&");
    build_query(&sign_header,input);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                   &key_header,&sign_header);
    std::__cxx11::string::operator=((string *)&postdata,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&sign_header);
    std::__cxx11::string::~string((string *)&key_header);
  }
  curl_easy_setopt(this->curl_,0x271f,postdata._M_dataplus._M_p);
  std::operator+(&key_header,"API-Key: ",&this->key_);
  signature((string *)&oss,this,&path,&nonce,&postdata);
  std::operator+(&sign_header,"API-Sign: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  uVar3 = curl_slist_append(0,key_header._M_dataplus._M_p);
  uVar3 = curl_slist_append(uVar3,sign_header._M_dataplus._M_p);
  curl_easy_setopt(this->curl_,0x2727,uVar3);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  curl_easy_setopt(this->curl_,0x2711,__return_storage_ptr__);
  iVar1 = curl_easy_perform(this->curl_);
  curl_slist_free_all(uVar3);
  if (iVar1 == 0) {
    std::__cxx11::string::~string((string *)&sign_header);
    std::__cxx11::string::~string((string *)&key_header);
    std::__cxx11::string::~string((string *)&postdata);
    std::__cxx11::string::~string((string *)&nonce);
    std::__cxx11::string::~string((string *)&method_url);
    std::__cxx11::string::~string((string *)&path);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"curl_easy_perform() failed: ");
  pcVar5 = (char *)curl_easy_strerror(iVar1);
  std::operator<<(poVar2,pcVar5);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,local_1c8);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KClient::private_method(const std::string& method, 
				 const KInput& input) const
{   
   // build method URL
   std::string path = "/" + version_ + "/private/" + method;
   std::string method_url = url_ + path;

   curl_easy_setopt(curl_, CURLOPT_URL, method_url.c_str());

   // create a nonce and and postdata 
   std::string nonce = create_nonce();
   std::string postdata = "nonce=" + nonce;

   // if 'input' is not empty generate other postdata
   if (!input.empty())
      postdata = postdata + "&" + build_query(input);
   curl_easy_setopt(curl_, CURLOPT_POSTFIELDS, postdata.c_str());

   // add custom header
   curl_slist* chunk = NULL;

   std::string key_header =  "API-Key: "  + key_;
   std::string sign_header = "API-Sign: " + signature(path, nonce, postdata);

   chunk = curl_slist_append(chunk, key_header.c_str());
   chunk = curl_slist_append(chunk, sign_header.c_str());
   curl_easy_setopt(curl_, CURLOPT_HTTPHEADER, chunk);
   
   // where CURL write callback function stores the response
   std::string response;
   curl_easy_setopt(curl_, CURLOPT_WRITEDATA, static_cast<void*>(&response));

   // perform CURL request
   CURLcode result = curl_easy_perform(curl_);

   // free the custom headers
   curl_slist_free_all(chunk);
  
   // check perform result
   if (result != CURLE_OK) {
      std::ostringstream oss;
      oss << "curl_easy_perform() failed: " << curl_easy_strerror(result);
      throw std::runtime_error(oss.str());
   }
   
   return response;
}